

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall CClient::PumpNetwork(CClient *this)

{
  CNetClient *pCVar1;
  int iVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  CNetChunk Packet;
  CNetChunk aCStack_128 [5];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = &this->m_NetClient;
  CNetClient::Update(pCVar1);
  iVar2 = (this->super_IClient).m_State;
  if (iVar2 != 0) {
    if (iVar2 == 4) goto LAB_0012257b;
    if ((iVar2 != 5) && (iVar2 = CNetClient::State(pCVar1), iVar2 == 0)) {
      SetState(this,0);
      pcVar3 = CNetClient::ErrorString(pCVar1);
      DisconnectWithReason(this,pcVar3);
      pcVar3 = CNetClient::ErrorString(pCVar1);
      str_format((char *)aCStack_128,0x100,"offline error=\'%s\'",pcVar3);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"client",aCStack_128,0);
    }
  }
  if (((this->super_IClient).m_State == 1) && (iVar2 = CNetClient::State(pCVar1), iVar2 == 2)) {
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"client","connected, sending info",0);
    SetState(this,2);
    SendInfo(this);
  }
LAB_0012257b:
  iVar2 = CNetClient::Recv(pCVar1,aCStack_128,(TOKEN *)0x0);
  while (iVar2 != 0) {
    if (((byte)aCStack_128[0].m_Flags & 2) == 0) {
      ProcessServerPacket(this,aCStack_128);
    }
    iVar2 = CNetClient::Recv(pCVar1,aCStack_128,(TOKEN *)0x0);
  }
  pCVar1 = &this->m_ContactClient;
  CNetClient::Update(pCVar1);
  iVar2 = CNetClient::Recv(pCVar1,aCStack_128,(TOKEN *)0x0);
  while (iVar2 != 0) {
    if (((byte)aCStack_128[0].m_Flags & 2) != 0) {
      ProcessConnlessPacket(this,aCStack_128);
    }
    iVar2 = CNetClient::Recv(pCVar1,aCStack_128,(TOKEN *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CClient::PumpNetwork()
{
	m_NetClient.Update();

	if(State() != IClient::STATE_DEMOPLAYBACK)
	{
		// check for errors
		if(State() != IClient::STATE_OFFLINE && State() != IClient::STATE_QUITING && m_NetClient.State() == NETSTATE_OFFLINE)
		{
			SetState(IClient::STATE_OFFLINE);
			DisconnectWithReason(m_NetClient.ErrorString());
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "offline error='%s'", m_NetClient.ErrorString());
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", aBuf);
		}

		//
		if(State() == IClient::STATE_CONNECTING && m_NetClient.State() == NETSTATE_ONLINE)
		{
			// we switched to online
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", "connected, sending info");
			SetState(IClient::STATE_LOADING);
			SendInfo();
		}
	}

	// process non-connless packets
	CNetChunk Packet;
	while(m_NetClient.Recv(&Packet))
	{
		if(!(Packet.m_Flags&NETSENDFLAG_CONNLESS))
			ProcessServerPacket(&Packet);
	}

	// process connless packets data
	m_ContactClient.Update();
	while(m_ContactClient.Recv(&Packet))
	{
		if(Packet.m_Flags&NETSENDFLAG_CONNLESS)
			ProcessConnlessPacket(&Packet);
	}
}